

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall
Lowerer::GenerateRecyclerOrMarkTempAlloc
          (Lowerer *this,Instr *instr,RegOpnd *dstOpnd,JnHelperMethod allocHelper,size_t allocSize,
          SymOpnd **tempObjectSymOpnd)

{
  ushort uVar1;
  SymOpnd *pSVar2;
  
  uVar1 = *(ushort *)&instr->field_0x36;
  if ((uVar1 & 8) == 0) {
    pSVar2 = (SymOpnd *)0x0;
    GenerateRecyclerAlloc(this,allocHelper,allocSize,dstOpnd,instr,false);
  }
  else {
    pSVar2 = GenerateMarkTempAlloc(this,dstOpnd,allocSize,instr);
  }
  *tempObjectSymOpnd = pSVar2;
  return (uVar1 & 8) == 0;
}

Assistant:

bool
Lowerer::GenerateRecyclerOrMarkTempAlloc(IR::Instr * instr, IR::RegOpnd * dstOpnd, IR::JnHelperMethod allocHelper, size_t allocSize, IR::SymOpnd ** tempObjectSymOpnd)
{
    if (instr->dstIsTempObject)
    {
        *tempObjectSymOpnd = GenerateMarkTempAlloc(dstOpnd, allocSize, instr);
        return false;
    }

    this->GenerateRecyclerAlloc(allocHelper, allocSize, dstOpnd, instr);
    *tempObjectSymOpnd = nullptr;
    return true;
}